

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<long,_std::allocator<long>_> *
mxx::allgather<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,long *data,size_t size,
          comm *comm)

{
  int iVar1;
  reference out;
  comm *comm_local;
  size_t size_local;
  long *data_local;
  vector<long,_std::allocator<long>_> *result;
  
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  iVar1 = mxx::comm::size(comm);
  std::vector<long,_std::allocator<long>_>::resize(__return_storage_ptr__,size * (long)iVar1);
  out = std::vector<long,_std::allocator<long>_>::operator[](__return_storage_ptr__,0);
  allgather<long>(data,size,out,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgather(const T* data, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    result.resize(size*comm.size());
    allgather(data, size, &result[0], comm);
    return result;
}